

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::SPIRVariable::SPIRVariable
          (SPIRVariable *this,TypeID basetype_,StorageClass storage_,ID initializer_,
          VariableID basevariable_)

{
  StorageClass storage__local;
  SPIRVariable *this_local;
  VariableID basevariable__local;
  ID initializer__local;
  TypeID basetype__local;
  
  IVariant::IVariant(&this->super_IVariant);
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRVariable_01411658;
  *(uint32_t *)&(this->super_IVariant).field_0xc = basetype_.id;
  this->storage = storage_;
  this->decoration = 0;
  (this->initializer).id = initializer_.id;
  (this->basevariable).id = basevariable_.id;
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->dereference_chain);
  this->compat_builtin = false;
  this->statically_assigned = false;
  TypedID<(diligent_spirv_cross::Types)0>::TypedID(&this->static_expression,0);
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::SmallVector
            (&this->dependees);
  this->deferred_declaration = false;
  this->phi_variable = false;
  this->allocate_temporary_copy = false;
  this->remapped_variable = false;
  this->remapped_components = 0;
  TypedID<(diligent_spirv_cross::Types)6>::TypedID(&this->dominator,0);
  this->loop_variable = false;
  this->loop_variable_enable = false;
  this->is_written_to = false;
  this->parameter = (Parameter *)0x0;
  return;
}

Assistant:

SPIRVariable(TypeID basetype_, spv::StorageClass storage_, ID initializer_ = 0, VariableID basevariable_ = 0)
	    : basetype(basetype_)
	    , storage(storage_)
	    , initializer(initializer_)
	    , basevariable(basevariable_)
	{
	}